

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

google_protobuf_FieldDescriptorProto **
google_protobuf_DescriptorProto_field(google_protobuf_DescriptorProto *msg,size_t *size)

{
  upb_Array *puVar1;
  google_protobuf_FieldDescriptorProto **ppgVar2;
  upb_MiniTableField field;
  upb_MiniTableField local_18;
  
  local_18.number_dont_copy_me__upb_internal_use_only = 2;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x20;
  local_18.presence = 0;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  puVar1 = upb_Message_GetArray(&msg->base_dont_copy_me__upb_internal_use_only,&local_18);
  if (puVar1 == (upb_Array *)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    ppgVar2 = (google_protobuf_FieldDescriptorProto **)0x0;
  }
  else {
    if (size != (size_t *)0x0) {
      *size = puVar1->size_dont_copy_me__upb_internal_use_only;
    }
    ppgVar2 = (google_protobuf_FieldDescriptorProto **)
              (puVar1->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return ppgVar2;
}

Assistant:

UPB_INLINE const google_protobuf_FieldDescriptorProto* const* google_protobuf_DescriptorProto_field(const google_protobuf_DescriptorProto* msg, size_t* size) {
  const upb_MiniTableField field = {2, UPB_SIZE(12, 32), 0, 0, 11, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__FieldDescriptorProto_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const google_protobuf_FieldDescriptorProto* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}